

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsFromCalledFun
          (MemorySSATransformation *this,RWNode *phi,RWSubgraph *subg,DefSite *ds)

{
  RWNode *this_00;
  bool bVar1;
  reference ppRVar2;
  RWBBlock *this_01;
  RWNodeCall *n;
  RWSubgraph *in_RDX;
  RWNode *callphi;
  RWBBlock *bblock;
  RWNodeCall *C;
  RWNode *callsite;
  iterator __end2;
  iterator __begin2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range2;
  DefSite *in_stack_00000088;
  RWNode *in_stack_00000090;
  MemorySSATransformation *in_stack_00000098;
  RWNode *in_stack_ffffffffffffff78;
  RWNodeCall *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  RWNodeType in_stack_ffffffffffffff94;
  DefSite *in_stack_ffffffffffffff98;
  MemorySSATransformation *in_stack_ffffffffffffffa0;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_30;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *local_28;
  
  local_28 = RWSubgraph::getCallers(in_RDX);
  local_30._M_current =
       (RWNode **)
       std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                 ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              ::operator*(&local_30);
    this_00 = *ppRVar2;
    RWNodeCall::get(&in_stack_ffffffffffffff80->super_RWNode);
    this_01 = RWNode::getBBlock(this_00);
    n = (RWNodeCall *)
        createPhi(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::insertBefore
              (&this_01->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>,(RWNode *)n,
               (RWNode *)in_stack_ffffffffffffffa0);
    RWNodeCall::addInput(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    RWNode::addDefUse(&in_stack_ffffffffffffff80->super_RWNode,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 = n;
    findDefinitions(in_stack_00000098,in_stack_00000090,in_stack_00000088);
    RWNode::addDefUse<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
              (&in_stack_ffffffffffffff80->super_RWNode,
               (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
               in_stack_ffffffffffffff78);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsFromCalledFun(RWNode *phi,
                                                           RWSubgraph *subg,
                                                           const DefSite &ds) {
    for (auto *callsite : subg->getCallers()) {
        auto *C = RWNodeCall::get(callsite);
        assert(C && "Callsite is not a call");

        auto *bblock = callsite->getBBlock();
        assert(bblock && getBBlockInfo(bblock).isCallBlock());

        // create input PHI for this call
        auto *callphi = createPhi(ds, RWNodeType::CALLIN);
        bblock->insertBefore(callphi, C);
        C->addInput(callphi);

        phi->addDefUse(callphi);
        callphi->addDefUse(findDefinitions(callphi, ds));
    }
}